

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void ecs_map_remove(ecs_map_t *map,ecs_map_key_t key)

{
  ecs_bucket_t *bucket;
  ulong uVar1;
  ulong uVar2;
  
  _ecs_assert(map != (ecs_map_t *)0x0,2,(char *)0x0,"map != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x162);
  if (map != (ecs_map_t *)0x0) {
    bucket = get_bucket(map,key);
    if (bucket != (ecs_bucket_t *)0x0) {
      uVar1 = 0;
      uVar2 = (ulong)(uint)bucket->count;
      if (bucket->count < 1) {
        uVar2 = uVar1;
      }
      for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
        if (bucket->keys[uVar1] == key) {
          remove_from_bucket(bucket,map->elem_size,key,(int32_t)uVar1);
          map->count = map->count + -1;
        }
      }
    }
    return;
  }
  __assert_fail("map != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0x162,"void ecs_map_remove(ecs_map_t *, ecs_map_key_t)");
}

Assistant:

void ecs_map_remove(
    ecs_map_t *map,
    ecs_map_key_t key)
{
    ecs_assert(map != NULL, ECS_INVALID_PARAMETER, NULL);

    ecs_bucket_t * bucket = get_bucket(map, key);
    if (!bucket) {
        return;
    }

    int32_t i, bucket_count = bucket->count;
    for (i = 0; i < bucket_count; i ++) {
        if (bucket->keys[i] == key) {
            remove_from_bucket(bucket, map->elem_size, key, i);
            map->count --;
        }
    } 
}